

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O3

void __thiscall zmq::session_base_t::engine_ready(session_base_t *this)

{
  pipe_t *ppVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long *plVar5;
  undefined4 extraout_var_00;
  bool conflates [2];
  pipe_t *pipes [2];
  object_t *parents [2];
  bool local_ea;
  undefined1 local_e9;
  pipe_t *local_e8;
  pipe_t *ppStack_e0;
  int local_d0;
  int local_cc;
  session_base_t *local_c8;
  socket_base_t *local_c0;
  undefined1 local_b8 [32];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  endpoint_type_t local_78;
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  endpoint_type_t local_30;
  undefined4 extraout_var;
  
  if (this->_pipe == (pipe_t *)0x0) {
    bVar2 = own_t::is_terminating(&this->super_own_t);
    if (!bVar2) {
      local_c0 = this->_socket;
      local_e8 = (pipe_t *)0x0;
      ppStack_e0 = (pipe_t *)0x0;
      if ((((this->super_own_t).options.conflate == true) &&
          (uVar3 = (uint)(byte)(this->super_own_t).options.type, uVar3 < 9)) &&
         ((0x1a6U >> (uVar3 & 0x1f) & 1) != 0)) {
        local_d0 = -1;
        local_cc = -1;
        local_ea = true;
      }
      else {
        local_d0 = (this->super_own_t).options.rcvhwm;
        local_cc = (this->super_own_t).options.sndhwm;
        local_ea = false;
      }
      local_e9 = local_ea;
      local_c8 = this;
      iVar4 = pipepair((object_t **)&local_c8,&local_e8,&local_d0,&local_ea);
      if (iVar4 != 0) {
        engine_ready();
      }
      pipe_t::set_event_sink(local_e8,&this->super_i_pipe_events);
      if (this->_pipe != (pipe_t *)0x0) {
        engine_ready();
      }
      ppVar1 = local_e8;
      this->_pipe = local_e8;
      iVar4 = (*this->_engine->_vptr_i_engine[8])();
      plVar5 = (long *)CONCAT44(extraout_var,iVar4);
      local_70._0_8_ = local_70 + 0x10;
      std::__cxx11::string::_M_construct<char*>((string *)local_70,*plVar5,plVar5[1] + *plVar5);
      local_50._M_p = (pointer)&local_40;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,plVar5[4],plVar5[5] + plVar5[4])
      ;
      local_30 = *(endpoint_type_t *)(plVar5 + 8);
      pipe_t::set_endpoint_pair(ppVar1,(endpoint_uri_pair_t *)local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
        operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
      }
      ppVar1 = ppStack_e0;
      iVar4 = (*this->_engine->_vptr_i_engine[8])();
      plVar5 = (long *)CONCAT44(extraout_var_00,iVar4);
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char*>((string *)local_b8,*plVar5,plVar5[1] + *plVar5);
      local_98._M_p = (pointer)&local_88;
      std::__cxx11::string::_M_construct<char*>((string *)&local_98,plVar5[4],plVar5[5] + plVar5[4])
      ;
      local_78 = *(endpoint_type_t *)(plVar5 + 8);
      pipe_t::set_endpoint_pair(ppVar1,(endpoint_uri_pair_t *)local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
      }
      object_t::send_bind((object_t *)this,&this->_socket->super_own_t,ppStack_e0,true);
    }
  }
  return;
}

Assistant:

void zmq::session_base_t::engine_ready ()
{
    //  Create the pipe if it does not exist yet.
    if (!_pipe && !is_terminating ()) {
        object_t *parents[2] = {this, _socket};
        pipe_t *pipes[2] = {NULL, NULL};

        const bool conflate = get_effective_conflate_option (options);

        int hwms[2] = {conflate ? -1 : options.rcvhwm,
                       conflate ? -1 : options.sndhwm};
        bool conflates[2] = {conflate, conflate};
        const int rc = pipepair (parents, pipes, hwms, conflates);
        errno_assert (rc == 0);

        //  Plug the local end of the pipe.
        pipes[0]->set_event_sink (this);

        //  Remember the local end of the pipe.
        zmq_assert (!_pipe);
        _pipe = pipes[0];

        //  The endpoints strings are not set on bind, set them here so that
        //  events can use them.
        pipes[0]->set_endpoint_pair (_engine->get_endpoint ());
        pipes[1]->set_endpoint_pair (_engine->get_endpoint ());

        //  Ask socket to plug into the remote end of the pipe.
        send_bind (_socket, pipes[1]);
    }
}